

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemdelegate.cpp
# Opt level: O1

void __thiscall
QItemDelegate::doLayout
          (QItemDelegate *this,QStyleOptionViewItem *option,QRect *checkRect,QRect *pixmapRect,
          QRect *textRect,bool hint)

{
  Representation RVar1;
  QWidget *this_00;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  QStyle *pQVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  Representation RVar17;
  Representation RVar18;
  Representation RVar19;
  int iVar20;
  long in_FS_OFFSET;
  QRect QVar21;
  QSize local_70;
  QRect local_68;
  QRect local_58;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = option->widget;
  if (this_00 == (QWidget *)0x0) {
    pQVar11 = QApplication::style();
  }
  else {
    pQVar11 = QWidget::style(this_00);
  }
  bVar2 = (checkRect->x1).m_i <= (checkRect->x2).m_i;
  bVar3 = (checkRect->y1).m_i <= (checkRect->y2).m_i;
  bVar4 = (pixmapRect->x1).m_i <= (pixmapRect->x2).m_i;
  bVar5 = (pixmapRect->y1).m_i <= (pixmapRect->y2).m_i;
  iVar13 = (textRect->x1).m_i;
  iVar10 = (textRect->x2).m_i;
  bVar6 = (textRect->y1).m_i <= (textRect->y2).m_i;
  if (((bVar3 && bVar2) || (bVar5 && bVar4)) || (iVar7 = 0, bVar6 && iVar13 <= iVar10)) {
    iVar7 = (**(code **)(*(long *)pQVar11 + 0xe0))(pQVar11,0x41,0,this_00);
    iVar7 = iVar7 + 1;
  }
  iVar20 = 0;
  if (bVar6 && iVar13 <= iVar10) {
    iVar20 = iVar7;
  }
  RVar19.m_i = (option->super_QStyleOption).rect.x1.m_i;
  RVar1.m_i = (option->super_QStyleOption).rect.y1.m_i;
  (textRect->x1).m_i = (textRect->x1).m_i - iVar20;
  (textRect->x2).m_i = (textRect->x2).m_i + iVar20;
  if (((!bVar5 || !bVar4) || !hint) && ((textRect->y2).m_i + 1 == (textRect->y1).m_i)) {
    iVar8 = QFontMetrics::height();
    (textRect->y2).m_i = iVar8 + (textRect->y1).m_i + -1;
  }
  iVar14 = 0;
  iVar8 = 0;
  if (bVar5 && bVar4) {
    iVar8 = ((pixmapRect->y2).m_i - (pixmapRect->y1).m_i) + 1;
    iVar14 = (((pixmapRect->x2).m_i + iVar7 * 2) - (pixmapRect->x1).m_i) + 1;
  }
  if (hint) {
    iVar15 = ((checkRect->y2).m_i - (checkRect->y1).m_i) + 1;
    iVar9 = ((textRect->y2).m_i - (textRect->y1).m_i) + 1;
    if (iVar9 <= iVar8) {
      iVar9 = iVar8;
    }
    if (iVar9 < iVar15) {
      iVar9 = iVar15;
    }
    iVar15 = (textRect->x1).m_i;
    iVar16 = (textRect->x2).m_i;
    if (option->decorationPosition < Top) {
      iVar15 = ((iVar16 + iVar14) - iVar15) + 1;
    }
    else {
      iVar15 = (iVar16 - iVar15) + 1;
      if (iVar15 <= iVar14) {
        iVar15 = iVar14;
      }
    }
  }
  else {
    iVar15 = ((option->super_QStyleOption).rect.x2.m_i - (option->super_QStyleOption).rect.x1.m_i) +
             1;
    iVar9 = ((option->super_QStyleOption).rect.y2.m_i - (option->super_QStyleOption).rect.y1.m_i) +
            1;
  }
  local_48.x1.m_i = 0;
  local_48.y1.m_i = 0;
  local_48.x2.m_i = -1;
  local_48.y2.m_i = -1;
  iVar16 = 0;
  if (bVar3 && bVar2) {
    iVar16 = ((iVar7 * 2 + (checkRect->x2).m_i) - (checkRect->x1).m_i) + 1;
    iVar12 = 0;
    if (hint) {
      iVar12 = iVar16;
    }
    iVar15 = iVar12 + iVar15;
    iVar12 = iVar16;
    local_48.x1.m_i = RVar19.m_i;
    if ((option->super_QStyleOption).direction == RightToLeft) {
      iVar12 = iVar15;
      local_48.x1.m_i = (iVar15 + RVar19.m_i) - iVar16;
    }
    local_48.y1.m_i = RVar1.m_i;
    local_48.y2.m_i = RVar1.m_i + iVar9 + -1;
    local_48.x2.m_i = iVar12 + RVar19.m_i + -1;
  }
  local_58.x1.m_i = 0;
  local_58.y1.m_i = 0;
  local_58.x2.m_i = -1;
  local_58.y2.m_i = -1;
  local_68.x1.m_i = 0;
  local_68.y1.m_i = 0;
  local_68.x2.m_i = -1;
  local_68.y2.m_i = -1;
  switch(option->decorationPosition) {
  case Left:
    if ((option->super_QStyleOption).direction == LeftToRight) {
      local_68.x1.m_i = RVar19.m_i + iVar16;
      local_58.y2.m_i = iVar9 + RVar1.m_i + -1;
      local_68.y2.m_i = local_58.y2.m_i;
      local_68.x2.m_i = local_68.x1.m_i + iVar14 + -1;
      local_58.x1.m_i = local_68.x1.m_i + iVar14;
      local_58.x2.m_i = (iVar15 - (iVar16 + iVar14)) + local_58.x1.m_i + -1;
    }
    else {
LAB_005635ab:
      iVar15 = iVar15 - (iVar16 + iVar14);
      local_58.x2.m_i = iVar15 + RVar19.m_i + -1;
      local_58.y2.m_i = iVar9 + RVar1.m_i + -1;
      local_68.x1.m_i = iVar15 + RVar19.m_i;
      local_68.y2.m_i = local_58.y2.m_i;
      local_68.x2.m_i = local_68.x1.m_i + iVar14 + -1;
      local_58.x1.m_i = RVar19.m_i;
    }
    goto LAB_005635e4;
  case Right:
    if ((option->super_QStyleOption).direction == LeftToRight) {
      RVar19.m_i = RVar19.m_i + iVar16;
      goto LAB_005635ab;
    }
    local_58.y2.m_i = iVar9 + RVar1.m_i + -1;
    local_68.y2.m_i = local_58.y2.m_i;
    local_68.x2.m_i = RVar19.m_i + iVar14 + -1;
    local_58.x1.m_i = iVar14 + RVar19.m_i;
    local_58.x2.m_i = ((RVar19.m_i + -1) - iVar16) + iVar15;
    local_68.x1.m_i = RVar19.m_i;
LAB_005635e4:
    local_68.y1.m_i = RVar1.m_i;
    local_58.y1.m_i = RVar1.m_i;
    break;
  case Top:
    iVar10 = 0;
    if (bVar5 && bVar4) {
      iVar10 = iVar7;
    }
    iVar8 = iVar8 + iVar10;
    if (hint) {
      iVar9 = ((textRect->y2).m_i - (textRect->y1).m_i) + 1;
    }
    else {
      iVar9 = iVar9 - iVar8;
    }
    if ((option->super_QStyleOption).direction == RightToLeft) {
      iVar10 = (iVar15 - iVar16) + RVar19.m_i;
    }
    else {
      RVar19.m_i = RVar19.m_i + iVar16;
      iVar10 = (iVar15 - iVar16) + RVar19.m_i;
    }
    local_68.y1.m_i = RVar1.m_i;
    local_68.x1.m_i = RVar19.m_i;
    local_58.x2.m_i = iVar10 + -1;
    local_68.y2.m_i = iVar8 + RVar1.m_i + -1;
    local_68.x2.m_i = local_58.x2.m_i;
    local_58.y2.m_i = iVar9 + iVar8 + RVar1.m_i + -1;
    local_58.x1.m_i = RVar19.m_i;
    local_58.y1.m_i = iVar8 + RVar1.m_i;
    break;
  case Bottom:
    if (bVar6 && iVar13 <= iVar10) {
      (textRect->y2).m_i = (textRect->y2).m_i + iVar20;
    }
    if (hint) {
      iVar9 = ((iVar8 + (textRect->y2).m_i) - (textRect->y1).m_i) + 1;
    }
    if ((option->super_QStyleOption).direction == RightToLeft) {
      iVar13 = (textRect->y2).m_i - (textRect->y1).m_i;
      iVar10 = (iVar15 - iVar16) + RVar19.m_i;
    }
    else {
      RVar19.m_i = RVar19.m_i + iVar16;
      iVar13 = (textRect->y2).m_i - (textRect->y1).m_i;
      iVar10 = (iVar15 - iVar16) + RVar19.m_i;
    }
    local_58.x2.m_i = iVar10 + -1;
    local_58.y2.m_i = iVar13 + RVar1.m_i;
    local_68.y1.m_i = local_58.y2.m_i + 1;
    local_68.x1.m_i = RVar19.m_i;
    local_68.y2.m_i = iVar9 + local_58.y2.m_i + 1 + ~(iVar13 + 1U);
    local_68.x2.m_i = local_58.x2.m_i;
    local_58.x1.m_i = RVar19.m_i;
    local_58.y1.m_i = RVar1.m_i;
    break;
  default:
    doLayout();
  }
  if (hint) {
    checkRect->x1 = (Representation)local_48.x1.m_i;
    checkRect->y1 = (Representation)local_48.y1.m_i;
    checkRect->x2 = (Representation)local_48.x2.m_i;
    checkRect->y2 = (Representation)local_48.y2.m_i;
    pixmapRect->x1 = (Representation)local_68.x1.m_i;
    pixmapRect->y1 = (Representation)local_68.y1.m_i;
    pixmapRect->x2 = (Representation)local_68.x2.m_i;
    pixmapRect->y2 = (Representation)local_68.y2.m_i;
  }
  else {
    local_70.wd.m_i = ((checkRect->x2).m_i - (checkRect->x1).m_i) + 1;
    local_70.ht.m_i = ((checkRect->y2).m_i - (checkRect->y1).m_i) + 1;
    QVar21 = QStyle::alignedRect((option->super_QStyleOption).direction,(Alignment)0x84,&local_70,
                                 &local_48);
    *checkRect = QVar21;
    local_70.wd.m_i = ((pixmapRect->x2).m_i - (pixmapRect->x1).m_i) + 1;
    local_70.ht.m_i = ((pixmapRect->y2).m_i - (pixmapRect->y1).m_i) + 1;
    QVar21 = QStyle::alignedRect((option->super_QStyleOption).direction,
                                 (Alignment)
                                 (option->decorationAlignment).
                                 super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                                 super_QFlagsStorage<Qt::AlignmentFlag>.i,&local_70,&local_68);
    *pixmapRect = QVar21;
    if (option->showDecorationSelected != true) {
      iVar10 = ((textRect->x2).m_i - (textRect->x1).m_i) + 1;
      iVar13 = ((textRect->y2).m_i - (textRect->y1).m_i) + 1;
      RVar17.m_i = (local_58.x2.m_i - local_58.x1.m_i) + 1;
      RVar18.m_i = (local_58.y2.m_i - local_58.y1.m_i) + 1;
      if (iVar10 < RVar17.m_i) {
        RVar17.m_i = iVar10;
      }
      if (iVar13 < RVar18.m_i) {
        RVar18.m_i = iVar13;
      }
      local_70.ht.m_i = RVar18.m_i;
      local_70.wd.m_i = RVar17.m_i;
      QVar21 = QStyle::alignedRect((option->super_QStyleOption).direction,
                                   (Alignment)
                                   (option->displayAlignment).
                                   super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                                   super_QFlagsStorage<Qt::AlignmentFlag>.i,&local_70,&local_58);
      *textRect = QVar21;
      goto LAB_005636fb;
    }
  }
  (textRect->x1).m_i = local_58.x1.m_i;
  (textRect->y1).m_i = local_58.y1.m_i;
  (textRect->x2).m_i = local_58.x2.m_i;
  (textRect->y2).m_i = local_58.y2.m_i;
LAB_005636fb:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QItemDelegate::doLayout(const QStyleOptionViewItem &option,
                             QRect *checkRect, QRect *pixmapRect, QRect *textRect,
                             bool hint) const
{
    Q_ASSERT(checkRect && pixmapRect && textRect);
    Q_D(const QItemDelegate);
    const QWidget *widget = d->widget(option);
    QStyle *style = widget ? widget->style() : QApplication::style();
    const bool hasCheck = checkRect->isValid();
    const bool hasPixmap = pixmapRect->isValid();
    const bool hasText = textRect->isValid();
    const bool hasMargin = (hasText | hasPixmap | hasCheck);
    const int frameHMargin = hasMargin ?
                style->pixelMetric(QStyle::PM_FocusFrameHMargin, nullptr, widget) + 1 : 0;
    const int textMargin = hasText ? frameHMargin : 0;
    const int pixmapMargin = hasPixmap ? frameHMargin : 0;
    const int checkMargin = hasCheck ? frameHMargin : 0;
    const int x = option.rect.left();
    const int y = option.rect.top();
    int w, h;

    textRect->adjust(-textMargin, 0, textMargin, 0); // add width padding
    if (textRect->height() == 0 && (!hasPixmap || !hint)) {
        //if there is no text, we still want to have a decent height for the item sizeHint and the editor size
        textRect->setHeight(option.fontMetrics.height());
    }

    QSize pm(0, 0);
    if (hasPixmap) {
        pm = pixmapRect->size();
        pm.rwidth() += 2 * pixmapMargin;
    }
    if (hint) {
        h = qMax(checkRect->height(), qMax(textRect->height(), pm.height()));
        if (option.decorationPosition == QStyleOptionViewItem::Left
            || option.decorationPosition == QStyleOptionViewItem::Right) {
            w = textRect->width() + pm.width();
        } else {
            w = qMax(textRect->width(), pm.width());
        }
    } else {
        w = option.rect.width();
        h = option.rect.height();
    }

    int cw = 0;
    QRect check;
    if (hasCheck) {
        cw = checkRect->width() + 2 * checkMargin;
        if (hint) w += cw;
        if (option.direction == Qt::RightToLeft) {
            check.setRect(x + w - cw, y, cw, h);
        } else {
            check.setRect(x, y, cw, h);
        }
    }

    // at this point w should be the *total* width

    QRect display;
    QRect decoration;
    switch (option.decorationPosition) {
    case QStyleOptionViewItem::Top: {
        if (hasPixmap)
            pm.setHeight(pm.height() + pixmapMargin); // add space
        h = hint ? textRect->height() : h - pm.height();

        if (option.direction == Qt::RightToLeft) {
            decoration.setRect(x, y, w - cw, pm.height());
            display.setRect(x, y + pm.height(), w - cw, h);
        } else {
            decoration.setRect(x + cw, y, w - cw, pm.height());
            display.setRect(x + cw, y + pm.height(), w - cw, h);
        }
        break; }
    case QStyleOptionViewItem::Bottom: {
        if (hasText)
            textRect->setHeight(textRect->height() + textMargin); // add space
        h = hint ? textRect->height() + pm.height() : h;

        if (option.direction == Qt::RightToLeft) {
            display.setRect(x, y, w - cw, textRect->height());
            decoration.setRect(x, y + textRect->height(), w - cw, h - textRect->height());
        } else {
            display.setRect(x + cw, y, w - cw, textRect->height());
            decoration.setRect(x + cw, y + textRect->height(), w - cw, h - textRect->height());
        }
        break; }
    case QStyleOptionViewItem::Left: {
        if (option.direction == Qt::LeftToRight) {
            decoration.setRect(x + cw, y, pm.width(), h);
            display.setRect(decoration.right() + 1, y, w - pm.width() - cw, h);
        } else {
            display.setRect(x, y, w - pm.width() - cw, h);
            decoration.setRect(display.right() + 1, y, pm.width(), h);
        }
        break; }
    case QStyleOptionViewItem::Right: {
        if (option.direction == Qt::LeftToRight) {
            display.setRect(x + cw, y, w - pm.width() - cw, h);
            decoration.setRect(display.right() + 1, y, pm.width(), h);
        } else {
            decoration.setRect(x, y, pm.width(), h);
            display.setRect(decoration.right() + 1, y, w - pm.width() - cw, h);
        }
        break; }
    default:
        qWarning("doLayout: decoration position is invalid");
        decoration = *pixmapRect;
        break;
    }

    if (!hint) { // we only need to do the internal layout if we are going to paint
        *checkRect = QStyle::alignedRect(option.direction, Qt::AlignCenter,
                                         checkRect->size(), check);
        *pixmapRect = QStyle::alignedRect(option.direction, option.decorationAlignment,
                                          pixmapRect->size(), decoration);
        // the text takes up all available space, unless the decoration is not shown as selected
        if (option.showDecorationSelected)
            *textRect = display;
        else
            *textRect = QStyle::alignedRect(option.direction, option.displayAlignment,
                                            textRect->size().boundedTo(display.size()), display);
    } else {
        *checkRect = check;
        *pixmapRect = decoration;
        *textRect = display;
    }
}